

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

FT_Pos af_cjk_snap_width(AF_Width widths,FT_UInt count,FT_Pos width)

{
  ulong uVar1;
  long local_50;
  FT_Pos dist;
  FT_Pos w;
  FT_Pos scaled;
  FT_Pos reference;
  FT_Pos best;
  FT_Pos FStack_20;
  FT_UInt n;
  FT_Pos width_local;
  FT_UInt count_local;
  AF_Width widths_local;
  
  reference = 0x62;
  scaled = width;
  for (best._4_4_ = 0; best._4_4_ < count; best._4_4_ = best._4_4_ + 1) {
    local_50 = width - widths[best._4_4_].cur;
    if (local_50 < 0) {
      local_50 = -local_50;
    }
    if (local_50 < reference) {
      reference = local_50;
      scaled = widths[best._4_4_].cur;
    }
  }
  uVar1 = scaled + 0x20U & 0xffffffffffffffc0;
  FStack_20 = width;
  if (width < scaled) {
    if ((long)(uVar1 - 0x30) < width) {
      FStack_20 = scaled;
    }
  }
  else if (width < (long)(uVar1 + 0x30)) {
    FStack_20 = scaled;
  }
  return FStack_20;
}

Assistant:

static FT_Pos
  af_cjk_snap_width( AF_Width  widths,
                     FT_UInt   count,
                     FT_Pos    width )
  {
    FT_UInt  n;
    FT_Pos   best      = 64 + 32 + 2;
    FT_Pos   reference = width;
    FT_Pos   scaled;


    for ( n = 0; n < count; n++ )
    {
      FT_Pos  w;
      FT_Pos  dist;


      w = widths[n].cur;
      dist = width - w;
      if ( dist < 0 )
        dist = -dist;
      if ( dist < best )
      {
        best      = dist;
        reference = w;
      }
    }

    scaled = FT_PIX_ROUND( reference );

    if ( width >= reference )
    {
      if ( width < scaled + 48 )
        width = reference;
    }
    else
    {
      if ( width > scaled - 48 )
        width = reference;
    }

    return width;
  }